

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_file_list.cpp
# Opt level: O3

bool __thiscall
duckdb::MultiFileList::Scan
          (MultiFileList *this,MultiFileListScanData *iterator,OpenFileInfo *result_file)

{
  OpenFileInfo maybe_file;
  undefined1 *local_48;
  long local_40;
  undefined1 local_38 [16];
  shared_ptr<duckdb::ExtendedOpenFileInfo,_true> local_28;
  
  (*this->_vptr_MultiFileList[8])(&local_48,this,iterator->current_file_idx);
  if (local_40 != 0) {
    ::std::__cxx11::string::_M_assign((string *)result_file);
    shared_ptr<duckdb::ExtendedOpenFileInfo,_true>::operator=(&result_file->extended_info,&local_28)
    ;
    iterator->current_file_idx = iterator->current_file_idx + 1;
  }
  if (local_28.internal.super___shared_ptr<duckdb::ExtendedOpenFileInfo,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_28.internal.
               super___shared_ptr<duckdb::ExtendedOpenFileInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_48 != local_38) {
    operator_delete(local_48);
  }
  return local_40 != 0;
}

Assistant:

bool MultiFileList::Scan(MultiFileListScanData &iterator, OpenFileInfo &result_file) {
	D_ASSERT(iterator.current_file_idx != DConstants::INVALID_INDEX);
	auto maybe_file = GetFile(iterator.current_file_idx);

	if (maybe_file.path.empty()) {
		D_ASSERT(iterator.current_file_idx >= GetTotalFileCount());
		return false;
	}

	result_file = maybe_file;
	iterator.current_file_idx++;
	return true;
}